

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::ExistingFileNamer::getReceivedFile
          (string *__return_storage_ptr__,ExistingFileNamer *this,string param_1)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->filePath)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ExistingFileNamer::getReceivedFile(std::string) const
    {
        return filePath;
    }